

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_ToLower::test_method(test_ToLower *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  value_type *pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  string_view str;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  value_type local_a9;
  char *local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4f3;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a0 = "";
  psVar2 = &local_58;
  local_58._M_dataplus._M_p._0_1_ = 0x40;
  local_a9 = '@';
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_98,&local_a8,0x4f3,1,2,psVar2,"ToLower(\'@\')",&local_a9,"\'@\'");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4f4;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_d8 = "";
  local_58._M_dataplus._M_p._0_1_ = 0x61;
  local_a9 = 'a';
  psVar2 = &local_58;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_98,&local_e0,0x4f4,1,2,psVar2,"ToLower(\'A\')",&local_a9,"\'a\'");
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4f5;
  file_01.m_begin = (iterator)&local_f0;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_108 = "";
  local_58._M_dataplus._M_p._0_1_ = 0x7a;
  local_a9 = 'z';
  psVar2 = &local_58;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_98,&local_110,0x4f5,1,2,psVar2,"ToLower(\'Z\')",&local_a9,"\'z\'");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4f6;
  file_02.m_begin = (iterator)&local_120;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_138 = "";
  local_58._M_dataplus._M_p._0_4_ = CONCAT31(local_58._M_dataplus._M_p._1_3_,0x5b);
  local_a9 = '[';
  psVar2 = &local_58;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_98,&local_140,0x4f6,1,2,psVar2,"ToLower(\'[\')",&local_a9,"\'[\'");
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4f7;
  file_03.m_begin = (iterator)&local_150;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
             msg_03);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_168 = "";
  local_a9 = '\0';
  local_58._M_dataplus._M_p._0_4_ = 0;
  pvVar1 = (iterator)0x2;
  pvVar3 = &local_a9;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
            (&local_98,&local_170,0x4f7,1,2,&local_a9,"ToLower(0)",&local_58,"0");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4f8;
  file_04.m_begin = (iterator)&local_180;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
             msg_04);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_198 = "";
  local_58._M_dataplus._M_p._0_4_ = CONCAT31(local_58._M_dataplus._M_p._1_3_,0xff);
  local_a9 = -1;
  psVar2 = &local_58;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_98,&local_1a0,0x4f8,1,2,psVar2,"ToLower(\'\\xff\')",&local_a9,"\'\\xff\'");
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4fa;
  file_05.m_begin = (iterator)&local_1b0;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c8 = "";
  ToLower_abi_cxx11_(&local_58,(string_view)(ZEXT816(0xc7f1cc) << 0x40));
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_98,&local_1d0,0x4fa,1,2,psVar2,"ToLower(\"\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4fb;
  file_06.m_begin = (iterator)&local_1e0;
  msg_06.m_end = (iterator)psVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
             msg_06);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f8 = "";
  str._M_str = "#HODL";
  str._M_len = 5;
  ToLower_abi_cxx11_(&local_58,str);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_98,&local_200,0x4fb,1,2,psVar2,"ToLower(\"#HODL\")","#hodl","\"#hodl\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4fc;
  file_07.m_begin = (iterator)&local_210;
  msg_07.m_end = (iterator)psVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_220,
             msg_07);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_011480b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_228 = "";
  ToLower_abi_cxx11_(&local_58,(string_view)(ZEXT816(0xc7e680) << 0x40));
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_98,&local_230,0x4fc,1,2,&local_58,"ToLower(\"\\x00\\xfe\\xff\")","",
             "\"\\x00\\xfe\\xff\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ToLower)
{
    BOOST_CHECK_EQUAL(ToLower('@'), '@');
    BOOST_CHECK_EQUAL(ToLower('A'), 'a');
    BOOST_CHECK_EQUAL(ToLower('Z'), 'z');
    BOOST_CHECK_EQUAL(ToLower('['), '[');
    BOOST_CHECK_EQUAL(ToLower(0), 0);
    BOOST_CHECK_EQUAL(ToLower('\xff'), '\xff');

    BOOST_CHECK_EQUAL(ToLower(""), "");
    BOOST_CHECK_EQUAL(ToLower("#HODL"), "#hodl");
    BOOST_CHECK_EQUAL(ToLower("\x00\xfe\xff"), "\x00\xfe\xff");
}